

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

uint32_t dtl_sv_to_u32(dtl_sv_t *self,_Bool *ok)

{
  dtl_sv_type_id dVar1;
  uint local_20;
  bool local_19;
  uint32_t retval;
  _Bool success;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  local_19 = false;
  local_20 = 0;
  if (self != (dtl_sv_t *)0x0) {
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      local_19 = -1 < (self->pAny->val).i32;
      if (local_19) {
        local_20 = (self->pAny->val).u32;
      }
      break;
    case DTL_SV_U32:
      local_20 = (self->pAny->val).u32;
      local_19 = true;
      break;
    case DTL_SV_I64:
      if ((-1 < (self->pAny->val).i64) && ((self->pAny->val).i64 < 0x100000000)) {
        local_20 = (uint)(self->pAny->val).u64;
        local_19 = true;
      }
      break;
    case DTL_SV_U64:
      if ((self->pAny->val).u64 < 0x100000000) {
        local_20 = (uint)(self->pAny->val).u64;
      }
      local_19 = true;
      break;
    case DTL_SV_FLT:
      local_19 = 0.0 <= (self->pAny->val).flt;
      if (local_19) {
        local_20 = (uint)(long)(self->pAny->val).flt;
      }
      break;
    case DTL_SV_DBL:
      local_19 = 0.0 <= (self->pAny->val).dbl;
      if (local_19) {
        local_20 = (uint)(long)(self->pAny->val).dbl;
      }
      break;
    case DTL_SV_CHAR:
      local_20 = (uint)(self->pAny->val).cr;
      local_19 = true;
      break;
    case DTL_SV_BOOL:
      local_20 = (uint)((self->pAny->val).cr & 1);
      local_19 = true;
      break;
    case DTL_SV_STR:
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  if (ok != (_Bool *)0x0) {
    *ok = local_19;
  }
  return local_20;
}

Assistant:

uint32_t dtl_sv_to_u32(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   uint32_t retval = 0u;
   if(self)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint32_t)self->pAny->val.i32;
            success = true;
         }
         break;
      case DTL_SV_U32:
         retval =  self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         if ( (self->pAny->val.i64 >= 0) && (self->pAny->val.i64 <= (int64_t)UINT32_MAX))
         {
            retval = (uint32_t)self->pAny->val.i64;
            success = true;
         }
         break;
      case DTL_SV_U64:
         if (self->pAny->val.u64 <= (uint64_t)UINT32_MAX)
         {
            retval = (uint32_t)self->pAny->val.u64;
            success = true;
         }
         success = true;
         break;
      case DTL_SV_FLT:
         if (self->pAny->val.flt >= 0.0)
         {
            retval = (uint32_t)self->pAny->val.flt;
            success = true;
         }
         break;
      case DTL_SV_DBL:
         if (self->pAny->val.dbl >= 0.0)
         {
            retval = (uint32_t)self->pAny->val.dbl;
            success = true;
         }
         break;
      case DTL_SV_BOOL:
         retval = (uint32_t) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (uint32_t)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}